

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O3

void draw_4_circles(Am_Drawonable *d)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  Am_Style::Am_Style(local_48,(Am_Style *)&black);
  Am_Style::Am_Style(local_50,(Am_Style *)&red);
  Am_Style::Am_Style(local_58,(Am_Style *)&black);
  Am_Style::Am_Style(local_60,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_68,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  set_style_array(local_48,local_50,local_58,local_60,local_68,local_70,local_38,local_40);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  iVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    iVar2 = iVar4 * 0x4b + 10;
    (**(code **)(*(long *)d + 0x130))
              (d,&Am_No_Style,iVar4 * 8 + 0x107180,iVar2,10,0x32,0x32,0,0x168,0,1);
    (**(code **)(*(long *)d + 0x130))
              (d,&Am_No_Style,iVar4 * 8 + 0x107188,iVar2,0x55,0x32,0x32,0,0x168,0,1);
    iVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void
draw_4_circles(Am_Drawonable *d)
{
  int x_counter, y_counter, x, y;

  set_style_array(black, red, black);
  for (x_counter = 0; x_counter <= 1; x_counter++) {
    for (y_counter = 0; y_counter <= 1; y_counter++) {
      x = 10 + (75 * x_counter);
      y = 10 + (75 * y_counter);
      d->Draw_Arc(Am_No_Style, style_array[x_counter + y_counter], x, y, 50,
                  50);
    }
  }
}